

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strnid.cc
# Opt level: O0

ASN1_STRING_TABLE * asn1_string_table_get(int nid)

{
  ASN1_STRING_TABLE *local_48;
  ASN1_STRING_TABLE *tbl;
  ASN1_STRING_TABLE key;
  ASN1_STRING_TABLE *pAStack_10;
  int nid_local;
  
  tbl._0_4_ = nid;
  key.flags._4_4_ = nid;
  local_48 = (ASN1_STRING_TABLE *)bsearch(&tbl,tbl_standard,0x13,0x28,table_cmp_void);
  pAStack_10 = local_48;
  if (local_48 == (ASN1_STRING_TABLE *)0x0) {
    CRYPTO_MUTEX_lock_read(&string_tables_lock);
    if (string_tables != (lhash_st_ASN1_STRING_TABLE *)0x0) {
      local_48 = lh_ASN1_STRING_TABLE_retrieve(string_tables,(ASN1_STRING_TABLE *)&tbl);
    }
    CRYPTO_MUTEX_unlock_read(&string_tables_lock);
    pAStack_10 = local_48;
  }
  return pAStack_10;
}

Assistant:

static const ASN1_STRING_TABLE *asn1_string_table_get(int nid) {
  ASN1_STRING_TABLE key;
  key.nid = nid;
  const ASN1_STRING_TABLE *tbl = reinterpret_cast<ASN1_STRING_TABLE *>(
      bsearch(&key, tbl_standard, OPENSSL_ARRAY_SIZE(tbl_standard),
              sizeof(ASN1_STRING_TABLE), table_cmp_void));
  if (tbl != NULL) {
    return tbl;
  }

  CRYPTO_MUTEX_lock_read(&string_tables_lock);
  if (string_tables != NULL) {
    tbl = lh_ASN1_STRING_TABLE_retrieve(string_tables, &key);
  }
  CRYPTO_MUTEX_unlock_read(&string_tables_lock);
  // Note returning |tbl| without the lock is only safe because
  // |ASN1_STRING_TABLE_add| cannot modify or delete existing entries. If we
  // wish to support that, this function must copy the result under a lock.
  return tbl;
}